

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtTriangleIndexVertexArray * __thiscall
cbtCollisionWorldImporter::createMeshInterface
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *meshData)

{
  int **ptr;
  cbtIntIndexData *pcVar1;
  short **ppsVar2;
  cbtShortIntIndexTripletData *pcVar3;
  cbtShortIntIndexData *pcVar4;
  uchar **ptr_00;
  cbtVector3FloatData **ptr_01;
  cbtVector3FloatData *pcVar5;
  cbtVector3DoubleData **ptr_02;
  cbtVector3DoubleData *pcVar6;
  cbtShortIntIndexTripletData *pcVar7;
  cbtCharIndexTripletData *pcVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  int *piVar11;
  int **ppiVar12;
  short **ppsVar13;
  uchar **ppuVar14;
  uchar *puVar15;
  cbtVector3DoubleData *pcVar16;
  cbtVector3FloatData **ppcVar17;
  cbtVector3DoubleData **ppcVar18;
  long lVar19;
  cbtMeshPartData *pcVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  cbtIndexedMesh local_68;
  cbtTriangleIndexVertexArray *local_38;
  
  iVar9 = (*this->_vptr_cbtCollisionWorldImporter[0x11])();
  local_38 = (cbtTriangleIndexVertexArray *)CONCAT44(extraout_var,iVar9);
  if (0 < meshData->m_numMeshParts) {
    lVar22 = 0;
    do {
      local_68.m_indexType = PHY_INTEGER;
      local_68.m_vertexType = PHY_FLOAT;
      pcVar20 = meshData->m_meshPartsPtr;
      local_68.m_numTriangles = pcVar20[lVar22].m_numTriangles;
      local_68.m_numVertices = pcVar20[lVar22].m_numVertices;
      if (pcVar20[lVar22].m_indices32 == (cbtIntIndexData *)0x0) {
        if (pcVar20[lVar22].m_3indices16 != (cbtShortIntIndexTripletData *)0x0) {
          local_68.m_indexType = PHY_SHORT;
          local_68.m_vertexType = PHY_FLOAT;
          local_68.m_triangleIndexStride = 6;
          piVar11 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 6,0x10);
          uVar10 = (this->m_shortIndexArrays).m_size;
          if (uVar10 == (this->m_shortIndexArrays).m_capacity) {
            iVar9 = uVar10 * 2;
            if (uVar10 == 0) {
              iVar9 = 1;
            }
            if ((int)uVar10 < iVar9) {
              if (iVar9 == 0) {
                ppsVar13 = (short **)0x0;
              }
              else {
                ppsVar13 = (short **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
                uVar10 = (this->m_shortIndexArrays).m_size;
              }
              if (0 < (int)uVar10) {
                uVar21 = 0;
                do {
                  ppsVar13[uVar21] = (this->m_shortIndexArrays).m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar10 != uVar21);
              }
              ppsVar2 = (this->m_shortIndexArrays).m_data;
              if ((ppsVar2 != (short **)0x0) && ((this->m_shortIndexArrays).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ppsVar2);
                uVar10 = (this->m_shortIndexArrays).m_size;
              }
              (this->m_shortIndexArrays).m_ownsMemory = true;
              (this->m_shortIndexArrays).m_data = ppsVar13;
              (this->m_shortIndexArrays).m_capacity = iVar9;
            }
          }
          (this->m_shortIndexArrays).m_data[(int)uVar10] = (short *)piVar11;
          (this->m_shortIndexArrays).m_size = uVar10 + 1;
          pcVar20 = meshData->m_meshPartsPtr;
          local_68.m_triangleIndexBase = (uchar *)piVar11;
          if (0 < (long)local_68.m_numTriangles) {
            pcVar3 = pcVar20[lVar22].m_3indices16;
            piVar11 = piVar11 + 1;
            lVar19 = 0;
            do {
              *(short *)(piVar11 + -1) = pcVar3[lVar19].m_values[0];
              *(short *)((long)piVar11 + -2) = pcVar3[lVar19].m_values[1];
              pcVar7 = pcVar3 + lVar19;
              lVar19 = lVar19 + 1;
              *(short *)piVar11 = pcVar7->m_values[2];
              piVar11 = (int *)((long)piVar11 + 6);
            } while (local_68.m_numTriangles != lVar19);
          }
        }
        if (pcVar20[lVar22].m_indices16 != (cbtShortIntIndexData *)0x0) {
          local_68.m_indexType = 3;
          local_68.m_triangleIndexStride = 6;
          piVar11 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 6,0x10);
          uVar10 = (this->m_shortIndexArrays).m_size;
          if (uVar10 == (this->m_shortIndexArrays).m_capacity) {
            iVar9 = uVar10 * 2;
            if (uVar10 == 0) {
              iVar9 = 1;
            }
            if ((int)uVar10 < iVar9) {
              if (iVar9 == 0) {
                ppsVar13 = (short **)0x0;
              }
              else {
                ppsVar13 = (short **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
                uVar10 = (this->m_shortIndexArrays).m_size;
              }
              if (0 < (int)uVar10) {
                uVar21 = 0;
                do {
                  ppsVar13[uVar21] = (this->m_shortIndexArrays).m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar10 != uVar21);
              }
              ppsVar2 = (this->m_shortIndexArrays).m_data;
              if ((ppsVar2 != (short **)0x0) && ((this->m_shortIndexArrays).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ppsVar2);
                uVar10 = (this->m_shortIndexArrays).m_size;
              }
              (this->m_shortIndexArrays).m_ownsMemory = true;
              (this->m_shortIndexArrays).m_data = ppsVar13;
              (this->m_shortIndexArrays).m_capacity = iVar9;
            }
          }
          (this->m_shortIndexArrays).m_data[(int)uVar10] = (short *)piVar11;
          (this->m_shortIndexArrays).m_size = uVar10 + 1;
          pcVar20 = meshData->m_meshPartsPtr;
          local_68.m_triangleIndexBase = (uchar *)piVar11;
          if (0 < local_68.m_numTriangles) {
            pcVar4 = pcVar20[lVar22].m_indices16;
            uVar21 = (ulong)(uint)(local_68.m_numTriangles * 3);
            if (local_68.m_numTriangles * 3 < 2) {
              uVar21 = 1;
            }
            uVar23 = 0;
            do {
              *(short *)((long)piVar11 + uVar23 * 2) = pcVar4[uVar23].m_value;
              uVar23 = uVar23 + 1;
            } while (uVar21 != uVar23);
          }
        }
        if (pcVar20[lVar22].m_3indices8 != (cbtCharIndexTripletData *)0x0) {
          local_68.m_indexType = 5;
          local_68.m_triangleIndexStride = 3;
          piVar11 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 3,0x10);
          uVar10 = (this->m_charIndexArrays).m_size;
          if (uVar10 == (this->m_charIndexArrays).m_capacity) {
            iVar9 = uVar10 * 2;
            if (uVar10 == 0) {
              iVar9 = 1;
            }
            if ((int)uVar10 < iVar9) {
              if (iVar9 == 0) {
                ppuVar14 = (uchar **)0x0;
              }
              else {
                ppuVar14 = (uchar **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
                uVar10 = (this->m_charIndexArrays).m_size;
              }
              if (0 < (int)uVar10) {
                uVar21 = 0;
                do {
                  ppuVar14[uVar21] = (this->m_charIndexArrays).m_data[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar10 != uVar21);
              }
              ptr_00 = (this->m_charIndexArrays).m_data;
              if ((ptr_00 != (uchar **)0x0) && ((this->m_charIndexArrays).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ptr_00);
                uVar10 = (this->m_charIndexArrays).m_size;
              }
              (this->m_charIndexArrays).m_ownsMemory = true;
              (this->m_charIndexArrays).m_data = ppuVar14;
              (this->m_charIndexArrays).m_capacity = iVar9;
            }
          }
          (this->m_charIndexArrays).m_data[(int)uVar10] = (uchar *)piVar11;
          (this->m_charIndexArrays).m_size = uVar10 + 1;
          local_68.m_triangleIndexBase = (uchar *)piVar11;
          if (0 < local_68.m_numTriangles) {
            puVar15 = (uchar *)((long)piVar11 + 2);
            lVar19 = 0;
            do {
              puVar15[-2] = meshData->m_meshPartsPtr[lVar22].m_3indices8[lVar19].m_values[0];
              puVar15[-1] = meshData->m_meshPartsPtr[lVar22].m_3indices8[lVar19].m_values[1];
              pcVar8 = meshData->m_meshPartsPtr[lVar22].m_3indices8 + lVar19;
              lVar19 = lVar19 + 1;
              *puVar15 = pcVar8->m_values[2];
              puVar15 = puVar15 + 3;
            } while (lVar19 < local_68.m_numTriangles);
          }
        }
      }
      else {
        local_68.m_triangleIndexStride = 0xc;
        piVar11 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 0xc,0x10);
        uVar10 = (this->m_indexArrays).m_size;
        if (uVar10 == (this->m_indexArrays).m_capacity) {
          iVar9 = uVar10 * 2;
          if (uVar10 == 0) {
            iVar9 = 1;
          }
          if ((int)uVar10 < iVar9) {
            if (iVar9 == 0) {
              ppiVar12 = (int **)0x0;
            }
            else {
              ppiVar12 = (int **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
              uVar10 = (this->m_indexArrays).m_size;
            }
            if (0 < (int)uVar10) {
              uVar21 = 0;
              do {
                ppiVar12[uVar21] = (this->m_indexArrays).m_data[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar10 != uVar21);
            }
            ptr = (this->m_indexArrays).m_data;
            if ((ptr != (int **)0x0) && ((this->m_indexArrays).m_ownsMemory == true)) {
              cbtAlignedFreeInternal(ptr);
              uVar10 = (this->m_indexArrays).m_size;
            }
            (this->m_indexArrays).m_ownsMemory = true;
            (this->m_indexArrays).m_data = ppiVar12;
            (this->m_indexArrays).m_capacity = iVar9;
          }
        }
        (this->m_indexArrays).m_data[(int)uVar10] = piVar11;
        (this->m_indexArrays).m_size = uVar10 + 1;
        local_68.m_triangleIndexBase = (uchar *)piVar11;
        if (0 < local_68.m_numTriangles) {
          lVar19 = 0;
          pcVar1 = meshData->m_meshPartsPtr[lVar22].m_indices32;
          do {
            piVar11[lVar19] = pcVar1[lVar19].m_value;
            lVar19 = lVar19 + 1;
          } while (lVar19 < (long)local_68.m_numTriangles * 3);
        }
      }
      if (meshData->m_meshPartsPtr[lVar22].m_vertices3f == (cbtVector3FloatData *)0x0) {
        local_68.m_vertexType = 1;
        local_68.m_vertexStride = 0x20;
        pcVar16 = (cbtVector3DoubleData *)
                  cbtAlignedAllocInternal((long)local_68.m_numVertices << 5,0x10);
        uVar10 = (this->m_doubleVertexArrays).m_size;
        if (uVar10 == (this->m_doubleVertexArrays).m_capacity) {
          iVar9 = uVar10 * 2;
          if (uVar10 == 0) {
            iVar9 = 1;
          }
          if ((int)uVar10 < iVar9) {
            if (iVar9 == 0) {
              ppcVar18 = (cbtVector3DoubleData **)0x0;
            }
            else {
              ppcVar18 = (cbtVector3DoubleData **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
              uVar10 = (this->m_doubleVertexArrays).m_size;
            }
            if (0 < (int)uVar10) {
              uVar21 = 0;
              do {
                ppcVar18[uVar21] = (this->m_doubleVertexArrays).m_data[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar10 != uVar21);
            }
            ptr_02 = (this->m_doubleVertexArrays).m_data;
            if ((ptr_02 != (cbtVector3DoubleData **)0x0) &&
               ((this->m_doubleVertexArrays).m_ownsMemory == true)) {
              cbtAlignedFreeInternal(ptr_02);
              uVar10 = (this->m_doubleVertexArrays).m_size;
            }
            (this->m_doubleVertexArrays).m_ownsMemory = true;
            (this->m_doubleVertexArrays).m_data = ppcVar18;
            (this->m_doubleVertexArrays).m_capacity = iVar9;
          }
        }
        (this->m_doubleVertexArrays).m_data[(int)uVar10] = pcVar16;
        (this->m_doubleVertexArrays).m_size = uVar10 + 1;
        if (0 < (long)local_68.m_numVertices) {
          lVar19 = 0;
          pcVar6 = meshData->m_meshPartsPtr[lVar22].m_vertices3d;
          do {
            *(undefined8 *)((long)pcVar16->m_floats + lVar19) =
                 *(undefined8 *)((long)pcVar6->m_floats + lVar19);
            *(undefined8 *)((long)pcVar16->m_floats + lVar19 + 8) =
                 *(undefined8 *)((long)pcVar6->m_floats + lVar19 + 8);
            *(undefined8 *)((long)pcVar16->m_floats + lVar19 + 0x10) =
                 *(undefined8 *)((long)pcVar6->m_floats + lVar19 + 0x10);
            *(undefined8 *)((long)pcVar16->m_floats + lVar19 + 0x18) =
                 *(undefined8 *)((long)pcVar6->m_floats + lVar19 + 0x18);
            lVar19 = lVar19 + 0x20;
          } while ((long)local_68.m_numVertices * 0x20 != lVar19);
        }
      }
      else {
        local_68._36_8_ = local_68._36_8_ & 0xffffffff;
        local_68.m_vertexStride = 0x10;
        pcVar16 = (cbtVector3DoubleData *)
                  cbtAlignedAllocInternal((long)local_68.m_numVertices << 4,0x10);
        uVar10 = (this->m_floatVertexArrays).m_size;
        if (uVar10 == (this->m_floatVertexArrays).m_capacity) {
          iVar9 = uVar10 * 2;
          if (uVar10 == 0) {
            iVar9 = 1;
          }
          if ((int)uVar10 < iVar9) {
            if (iVar9 == 0) {
              ppcVar17 = (cbtVector3FloatData **)0x0;
            }
            else {
              ppcVar17 = (cbtVector3FloatData **)cbtAlignedAllocInternal((long)iVar9 << 3,0x10);
              uVar10 = (this->m_floatVertexArrays).m_size;
            }
            if (0 < (int)uVar10) {
              uVar21 = 0;
              do {
                ppcVar17[uVar21] = (this->m_floatVertexArrays).m_data[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar10 != uVar21);
            }
            ptr_01 = (this->m_floatVertexArrays).m_data;
            if ((ptr_01 != (cbtVector3FloatData **)0x0) &&
               ((this->m_floatVertexArrays).m_ownsMemory == true)) {
              cbtAlignedFreeInternal(ptr_01);
              uVar10 = (this->m_floatVertexArrays).m_size;
            }
            (this->m_floatVertexArrays).m_ownsMemory = true;
            (this->m_floatVertexArrays).m_data = ppcVar17;
            (this->m_floatVertexArrays).m_capacity = iVar9;
          }
        }
        (this->m_floatVertexArrays).m_data[(int)uVar10] = (cbtVector3FloatData *)pcVar16;
        (this->m_floatVertexArrays).m_size = uVar10 + 1;
        if (0 < (long)local_68.m_numVertices) {
          lVar19 = 0;
          pcVar5 = meshData->m_meshPartsPtr[lVar22].m_vertices3f;
          do {
            *(undefined4 *)((long)pcVar16->m_floats + lVar19) =
                 *(undefined4 *)((long)pcVar5->m_floats + lVar19);
            *(undefined4 *)((long)pcVar16->m_floats + lVar19 + 4) =
                 *(undefined4 *)((long)pcVar5->m_floats + lVar19 + 4);
            *(undefined4 *)((long)pcVar16->m_floats + lVar19 + 8) =
                 *(undefined4 *)((long)pcVar5->m_floats + lVar19 + 8);
            *(undefined4 *)((long)pcVar16->m_floats + lVar19 + 0xc) =
                 *(undefined4 *)((long)pcVar5->m_floats + lVar19 + 0xc);
            lVar19 = lVar19 + 0x10;
          } while ((long)local_68.m_numVertices * 0x10 != lVar19);
        }
      }
      local_68.m_vertexBase = (uchar *)pcVar16;
      if (((int *)local_68.m_triangleIndexBase != (int *)0x0) &&
         (pcVar16 != (cbtVector3DoubleData *)0x0)) {
        cbtTriangleIndexVertexArray::addIndexedMesh(local_38,&local_68,local_68.m_indexType);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < meshData->m_numMeshParts);
  }
  return local_38;
}

Assistant:

cbtTriangleIndexVertexArray* cbtCollisionWorldImporter::createMeshInterface(cbtStridingMeshInterfaceData& meshData)
{
	cbtTriangleIndexVertexArray* meshInterface = createTriangleMeshContainer();

	for (int i = 0; i < meshData.m_numMeshParts; i++)
	{
		cbtIndexedMesh meshPart;
		meshPart.m_numTriangles = meshData.m_meshPartsPtr[i].m_numTriangles;
		meshPart.m_numVertices = meshData.m_meshPartsPtr[i].m_numVertices;

		if (meshData.m_meshPartsPtr[i].m_indices32)
		{
			meshPart.m_indexType = PHY_INTEGER;
			meshPart.m_triangleIndexStride = 3 * sizeof(int);
			int* indexArray = (int*)cbtAlignedAlloc(sizeof(int) * 3 * meshPart.m_numTriangles, 16);
			m_indexArrays.push_back(indexArray);
			for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
			{
				indexArray[j] = meshData.m_meshPartsPtr[i].m_indices32[j].m_value;
			}
			meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
		}
		else
		{
			if (meshData.m_meshPartsPtr[i].m_3indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = sizeof(short int) * 3;  //sizeof(cbtShortIntIndexTripletData);

				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
			if (meshData.m_meshPartsPtr[i].m_indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = 3 * sizeof(short int);
				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);
				for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
				{
					indexArray[j] = meshData.m_meshPartsPtr[i].m_indices16[j].m_value;
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}

			if (meshData.m_meshPartsPtr[i].m_3indices8)
			{
				meshPart.m_indexType = PHY_UCHAR;
				meshPart.m_triangleIndexStride = sizeof(unsigned char) * 3;

				unsigned char* indexArray = (unsigned char*)cbtAlignedAlloc(sizeof(unsigned char) * 3 * meshPart.m_numTriangles, 16);
				m_charIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
		}

		if (meshData.m_meshPartsPtr[i].m_vertices3f)
		{
			meshPart.m_vertexType = PHY_FLOAT;
			meshPart.m_vertexStride = sizeof(cbtVector3FloatData);
			cbtVector3FloatData* vertices = (cbtVector3FloatData*)cbtAlignedAlloc(sizeof(cbtVector3FloatData) * meshPart.m_numVertices, 16);
			m_floatVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}
		else
		{
			meshPart.m_vertexType = PHY_DOUBLE;
			meshPart.m_vertexStride = sizeof(cbtVector3DoubleData);

			cbtVector3DoubleData* vertices = (cbtVector3DoubleData*)cbtAlignedAlloc(sizeof(cbtVector3DoubleData) * meshPart.m_numVertices, 16);
			m_doubleVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}

		if (meshPart.m_triangleIndexBase && meshPart.m_vertexBase)
		{
			meshInterface->addIndexedMesh(meshPart, meshPart.m_indexType);
		}
	}

	return meshInterface;
}